

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::Argument::throw_required_arg_no_value_provided_error(Argument *this)

{
  string_view *psVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  runtime_error *this_00;
  string local_1d8 [48];
  size_t local_1a8;
  char *pcStack_1a0;
  stringstream local_198 [8];
  stringstream stream;
  basic_ostream<char,_std::char_traits<char>_> local_188 [376];
  Argument *local_10;
  Argument *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  psVar1 = &this->m_used_name;
  local_1a8 = psVar1->_M_len;
  pcStack_1a0 = (this->m_used_name)._M_str;
  __str._M_len = psVar1->_M_len;
  __str._M_str = psVar1->_M_str;
  pbVar2 = std::operator<<(local_188,__str);
  std::operator<<(pbVar2,": no value provided.");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_00,local_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_required_arg_no_value_provided_error() const {
    std::stringstream stream;
    stream << m_used_name << ": no value provided.";
    throw std::runtime_error(stream.str());
  }